

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O1

void makeroguerooms(level *lev)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  uint uVar6;
  uchar *puVar7;
  long lVar8;
  ulong uVar9;
  rogueroom (*parVar10) [3];
  rogueroom *prVar11;
  ulong uVar12;
  int lowy;
  long lVar13;
  long lVar14;
  
  lev->nroom = 0;
  lVar13 = 0x327d15;
  lVar14 = 0;
  do {
    uVar6 = (lVar14 == 2) + 3;
    lVar8 = 0;
    do {
      uVar3 = mt_random();
      if (uVar3 * -0x33333333 < 0x33333334) {
        if ((lev->nroom == 0) && (lVar14 == 2 || lVar8 == 0x48)) goto LAB_0019dc73;
        *(undefined1 *)(lVar13 + -1 + lVar8) = 0;
        uVar3 = mt_random();
        *(char *)(lVar13 + -5 + lVar8) =
             ((char)uVar3 -
             ((char)(uVar3 / 0x16) + (char)(uVar3 / 0x16) * '\x14' + (char)(uVar3 / 0x16))) + '\x02'
        ;
        uVar3 = mt_random();
        *(char *)(lVar13 + -4 + lVar8) = (char)(uVar3 % uVar6) + '\x02';
      }
      else {
LAB_0019dc73:
        *(undefined1 *)(lVar13 + -1 + lVar8) = 1;
        uVar3 = mt_random();
        *(char *)(lVar13 + -3 + lVar8) =
             ((char)uVar3 -
             ((char)(uVar3 / 0x16) + (char)(uVar3 / 0x16) * '\x14' + (char)(uVar3 / 0x16))) + '\x02'
        ;
        uVar3 = mt_random();
        *(char *)(lVar13 + -2 + lVar8) = (char)(uVar3 % uVar6) + '\x02';
        cVar1 = *(char *)(lVar13 + -3 + lVar8);
        uVar3 = mt_random();
        *(char *)(lVar13 + -5 + lVar8) =
             SUB161(ZEXT416(uVar3) % SEXT816(0x18 - (long)cVar1),0) + '\x01';
        cVar1 = *(char *)(lVar13 + -2 + lVar8);
        uVar3 = mt_random();
        *(char *)(lVar13 + -4 + lVar8) =
             SUB161(ZEXT416(uVar3) % SEXT816((long)(((ulong)(lVar14 == 2) + 5) - (long)cVar1)),0) +
             '\x01';
        lev->nroom = lev->nroom + 1;
      }
      *(undefined1 *)(lVar13 + lVar8) = 0;
      lVar8 = lVar8 + 0x24;
    } while (lVar8 != 0x6c);
    lVar14 = lVar14 + 1;
    lVar13 = lVar13 + 0xc;
    if (lVar14 == 3) {
      uVar6 = mt_random();
      uVar3 = mt_random();
      miniwalk(uVar6 % 3,uVar3 % 3);
      lev->nroom = 0;
      parVar10 = r;
      lVar13 = 0;
      do {
        lVar14 = 0;
        prVar11 = *parVar10;
        do {
          if (prVar11->real != '\0') {
            iVar4 = lev->nroom;
            prVar11->nroom = iVar4;
            smeq[iVar4] = iVar4;
            iVar4 = (int)((rogueroom *)&prVar11->rlx)->rlx;
            lowy = (int)prVar11->rly + (int)lVar13 * 7;
            cVar1 = prVar11->dx;
            cVar2 = prVar11->dy;
            uVar6 = mt_random();
            add_room(lev,(int)lVar14 + iVar4 + 1,lowy,cVar1 + iVar4 + (int)lVar14,cVar2 + lowy + -1,
                     uVar6 * -0x49249249 < 0x24924925,'\0','\0');
          }
          lVar14 = lVar14 + 0x1a;
          prVar11 = prVar11 + 3;
        } while (lVar14 != 0x4e);
        lVar13 = lVar13 + 1;
        parVar10 = (rogueroom (*) [3])((long)parVar10 + 0xc);
      } while (lVar13 != 3);
      puVar5 = &r[0][0].doortable;
      uVar9 = 0;
      do {
        uVar12 = 0;
        puVar7 = puVar5;
        do {
          if ((*puVar7 & 2) != 0) {
            roguecorr(lev,(int)uVar12,(int)uVar9,2);
          }
          if ((*puVar7 & 8) != 0) {
            roguecorr(lev,(int)uVar12,(int)uVar9,8);
          }
          if ((*puVar7 & 4) != 0) {
            impossible("left end of %d, %d never connected?",uVar12 & 0xffffffff,uVar9 & 0xffffffff)
            ;
          }
          if ((*puVar7 & 1) != 0) {
            impossible("up end of %d, %d never connected?",uVar12 & 0xffffffff,uVar9 & 0xffffffff);
          }
          uVar12 = uVar12 + 1;
          puVar7 = puVar7 + 0x24;
        } while (uVar12 != 3);
        uVar9 = uVar9 + 1;
        puVar5 = puVar5 + 0xc;
      } while (uVar9 != 3);
      return;
    }
  } while( true );
}

Assistant:

void makeroguerooms(struct level *lev) {
	int x,y;
	/* Rogue levels are structured 3 by 3, with each section containing
	 * a room or an intersection.  The minimum width is 2 each way.
	 * One difference between these and "real" Rogue levels: real Rogue
	 * uses 24 rows and this game only 23.  So we cheat a bit by making
	 * the second row of rooms not as deep.
	 *
	 * Each normal space has 6/7 rows and 25 columns in which a room may
	 * actually be placed.  Walls go from rows 0-5/6 and columns 0-24.
	 * Not counting walls, the room may go in
	 * rows 1-5 and columns 1-23 (numbering starting at 0).  A room
	 * coordinate of this type may be converted to a level coordinate
	 * by adding 1+28*x to the column, and 7*y to the row.  (The 1
	 * is because column 0 isn't used [we only use 1-78]).
	 * Room height may be 2-4 (2-5 on last row), length 2-23 (not
	 * counting walls)
	 */
#define here r[x][y]

	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		/* Note: we want to insure at least 1 room.  So, if the
		 * first 8 are all dummies, force the last to be a room.
		 */
		if (!rn2(5) && (lev->nroom || (x<2 && y<2))) {
			/* Arbitrary: dummy rooms may only go where real
			 * ones do.
			 */
			here.real = FALSE;
			here.rlx = rn1(22, 2);
			here.rly = rn1((y==2)?4:3, 2);
		} else {
			here.real = TRUE;
			here.dx = rn1(22, 2); /* 2-23 long, plus walls */
			here.dy = rn1((y==2)?4:3, 2); /* 2-5 high, plus walls */

			/* boundaries of room floor */
			here.rlx = rnd(23 - here.dx + 1);
			here.rly = rnd(((y==2) ? 5 : 4)- here.dy + 1);
			lev->nroom++;
		}
		here.doortable = 0;
	}
	x = rn2(3);
	y = rn2(3);
	miniwalk(x, y);
	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.real) { /* Make a room */
			int lowx, lowy, hix, hiy;

			r[x][y].nroom = lev->nroom;
			smeq[lev->nroom] = lev->nroom;

			lowx = 1 + 26*x + here.rlx;
			lowy = 7*y + here.rly;
			hix = 1 + 26*x + here.rlx + here.dx - 1;
			hiy = 7*y + here.rly + here.dy - 1;
			/* Strictly speaking, it should be lit only if above
			 * level 10, but since Rogue rooms are only
			 * encountered below level 10, use !rn2(7).
			 */
			add_room(lev, lowx, lowy, hix, hiy,
				 (boolean) !rn2(7), OROOM, FALSE);
		}
	}

	/* Now, add connecting corridors. */
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.doortable & DOWN)
			roguecorr(lev, x, y, DOWN);
		if (here.doortable & RIGHT)
			roguecorr(lev, x, y, RIGHT);
		if (here.doortable & LEFT)
			impossible ("left end of %d, %d never connected?",x,y);
		if (here.doortable & UP)
			impossible ("up end of %d, %d never connected?",x,y);
	}
}